

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsExecuter.h
# Opt level: O3

bool __thiscall Refal2::COperationsExecuter::matchRightBeginSaveToTable_V(COperationsExecuter *this)

{
  int iVar1;
  CNode<Refal2::CUnit> *pCVar2;
  CNode<Refal2::CUnit> *pCVar3;
  
  pCVar2 = this->right->prev;
  this->right = pCVar2;
  if (pCVar2 == (CNode<Refal2::CUnit> *)0x0) {
    __assert_fail("right != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/OperationsExecuter.h"
                  ,0x10b,"bool Refal2::COperationsExecuter::shiftRight()");
  }
  pCVar3 = this->left;
  if (pCVar3 != pCVar2) {
    if (((pCVar2->super_CUnit).type & UT_RightParen) != 0) {
      this->right = (CUnitNode *)(pCVar2->super_CUnit).field_1;
    }
    this->operation = this->operation->next;
    saveState(this);
    iVar1 = this->tableTop;
    if (iVar1 < (((this->super_CExecutionContext).Program.
                  super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_CCompilationContext).maxTableSize) {
      this->table[iVar1] = this->right;
      this->tableTop = iVar1 + 1;
      if (iVar1 + 1 <
          (((this->super_CExecutionContext).Program.
            super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_CCompilationContext).maxTableSize) {
        this->table[(long)iVar1 + 1] = pCVar2;
        this->tableTop = iVar1 + 2;
        goto LAB_001275a9;
      }
    }
    __assert_fail("tableTop < Program->MaxTableSize()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/OperationsExecuter.h"
                  ,0xef,"void Refal2::COperationsExecuter::saveToTable(CUnitNode *const)");
  }
LAB_001275a9:
  return pCVar3 != pCVar2;
}

Assistant:

inline bool COperationsExecuter::shiftRight()
{
	right = right->Prev();
	assert( right != nullptr );
	return ( left != right );
}